

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_glsl.cpp
# Opt level: O1

string * __thiscall
spirv_cross::CompilerGLSL::constant_op_expression_abi_cxx11_
          (string *__return_storage_ptr__,CompilerGLSL *this,SPIRConstantOp *cop)

{
  int iVar1;
  ConstantID const_id;
  uint32_t uVar2;
  uint32_t id;
  TypeID type_id;
  uint32_t *puVar3;
  uint *puVar4;
  bool bVar5;
  BaseType BVar6;
  SPIRConstantOp *pSVar7;
  CompilerGLSL *this_00;
  ulong uVar8;
  bool skip_cast_if_equal_type;
  bool bVar9;
  uint uVar10;
  ConstantID const_id_00;
  SPIRType *type;
  SPIRType *pSVar11;
  long *plVar12;
  mapped_type *initializers;
  runtime_error *prVar13;
  char *pcVar14;
  Constant *pCVar15;
  uint uVar16;
  undefined *puVar17;
  TypedID<(spirv_cross::Types)3> *pTVar18;
  char (*in_R9) [2];
  ConstantID const_id_01;
  ulong uVar19;
  ulong uVar20;
  BaseType input_type;
  TypeID local_24c;
  string local_248;
  SPIRConstantOp *local_228;
  CompilerGLSL *local_220;
  string op;
  SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> new_init;
  string right_arg;
  SPIRConstant tmp_const;
  
  type = Variant::get<spirv_cross::SPIRType>
                   ((this->super_Compiler).ir.ids.super_VectorView<spirv_cross::Variant>.ptr +
                    (cop->basetype).id);
  op._M_dataplus._M_p = (pointer)&op.field_2;
  op._M_string_length = 0;
  op.field_2._M_local_buf[0] = '\0';
  uVar10 = 0x81;
  if ((this->options).es != false) {
    uVar10 = 299;
  }
  if ((this->options).version <= uVar10) {
    iVar1 = *(int *)&(cop->super_IVariant).field_0xc;
    uVar10 = iVar1 - 0x6d;
    if (((uVar10 < 0x40) && ((0x8000040012000019U >> ((ulong)uVar10 & 0x3f) & 1) != 0)) ||
       ((uVar10 = iVar1 - 0xae, uVar10 < 0x15 && ((0x100015U >> (uVar10 & 0x1f) & 1) != 0)))) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error
                (prVar13,"Unsigned integers are not supported on legacy targets.");
      goto LAB_0013a5d4;
    }
  }
  iVar1 = *(int *)&(cop->super_IVariant).field_0xc;
  if (iVar1 < 0x7e) {
    if (0x70 < iVar1) {
      if (iVar1 - 0x71U < 3) {
        type_to_glsl_constructor_abi_cxx11_((string *)&tmp_const,this,type);
        ::std::__cxx11::string::operator=((string *)&op,(string *)&tmp_const);
        if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant != &tmp_const.m) {
          operator_delete(tmp_const.super_IVariant._vptr_IVariant);
        }
        goto LAB_0013a47a;
      }
      goto switchD_001396cd_caseD_7f;
    }
    local_228 = cop;
    if (iVar1 == 0x4f) {
      type_to_glsl_constructor_abi_cxx11_(__return_storage_ptr__,this,type);
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      pSVar11 = Compiler::expression_type
                          (&this->super_Compiler,
                           *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      uVar10 = pSVar11->vecsize;
      to_enclosed_expression_abi_cxx11_
                ((string *)&new_init,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true)
      ;
      to_enclosed_expression_abi_cxx11_
                (&right_arg,this,(cop->arguments).super_VectorView<unsigned_int>.ptr[1],true);
      if (2 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
        uVar19 = 2;
        do {
          uVar16 = (cop->arguments).super_VectorView<unsigned_int>.ptr[uVar19];
          if (uVar16 == 0xffffffff) {
            SPIRConstant::SPIRConstant(&tmp_const);
            cop = local_228;
            uVar2 = (type->parent_type).id;
            tmp_const.super_IVariant._12_4_ = uVar2;
            if (uVar2 == 0) {
              __assert_fail("type.parent_type != ID(0)",
                            "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]SPIRV-Cross/spirv_glsl.cpp"
                            ,0x1676,
                            "virtual string spirv_cross::CompilerGLSL::constant_op_expression(const SPIRConstantOp &)"
                           );
            }
            constant_expression_abi_cxx11_(&local_248,this,&tmp_const,false,false);
            ::std::__cxx11::string::_M_append
                      ((char *)__return_storage_ptr__,(ulong)local_248._M_dataplus._M_p);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_248._M_dataplus._M_p != &local_248.field_2) {
              operator_delete(local_248._M_dataplus._M_p);
            }
            tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_003601a0;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)tmp_const.specialization_constant_macro_name._M_dataplus._M_p !=
                &tmp_const.specialization_constant_macro_name.field_2) {
              operator_delete(tmp_const.specialization_constant_macro_name._M_dataplus._M_p);
            }
            tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
            buffer_size = 0;
            if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
                tmp_const.subconstants.
                super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
                &tmp_const.subconstants.stack_storage) {
              free(tmp_const.subconstants.
                   super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr);
            }
          }
          else {
            local_248._M_dataplus._M_p = (pointer)&local_248.field_2;
            if (uVar16 < uVar10) {
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_248,
                         new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                         ,(long)&(new_init.
                                  super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                                 )->id +
                          new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
                          buffer_size);
              ::std::__cxx11::string::append((char *)&local_248);
              plVar12 = (long *)::std::__cxx11::string::_M_replace_aux
                                          ((ulong)&local_248,local_248._M_string_length,0,'\x01');
              cop = local_228;
              tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&tmp_const.m;
              pCVar15 = (Constant *)(plVar12 + 2);
              if ((Constant *)*plVar12 == pCVar15) {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.m.c[0].r[1] = *(Constant *)(plVar12 + 3);
              }
              else {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.super_IVariant._vptr_IVariant = (_func_int **)*plVar12;
              }
              tmp_const.super_IVariant._8_8_ = plVar12[1];
              *plVar12 = (long)pCVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,
                         (ulong)tmp_const.super_IVariant._vptr_IVariant);
              if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant != &tmp_const.m) {
                operator_delete(tmp_const.super_IVariant._vptr_IVariant);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) {
LAB_00139c4f:
                operator_delete(local_248._M_dataplus._M_p);
              }
            }
            else {
              ::std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_248,right_arg._M_dataplus._M_p,
                         right_arg._M_dataplus._M_p + right_arg._M_string_length);
              ::std::__cxx11::string::append((char *)&local_248);
              plVar12 = (long *)::std::__cxx11::string::_M_replace_aux
                                          ((ulong)&local_248,local_248._M_string_length,0,'\x01');
              cop = local_228;
              tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&tmp_const.m;
              pCVar15 = (Constant *)(plVar12 + 2);
              if ((Constant *)*plVar12 == pCVar15) {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.m.c[0].r[1] = *(Constant *)(plVar12 + 3);
              }
              else {
                tmp_const.m.c[0].r[0] = *pCVar15;
                tmp_const.super_IVariant._vptr_IVariant = (_func_int **)*plVar12;
              }
              tmp_const.super_IVariant._8_8_ = plVar12[1];
              *plVar12 = (long)pCVar15;
              plVar12[1] = 0;
              *(undefined1 *)(plVar12 + 2) = 0;
              ::std::__cxx11::string::_M_append
                        ((char *)__return_storage_ptr__,
                         (ulong)tmp_const.super_IVariant._vptr_IVariant);
              if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant != &tmp_const.m) {
                operator_delete(tmp_const.super_IVariant._vptr_IVariant);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_248._M_dataplus._M_p != &local_248.field_2) goto LAB_00139c4f;
            }
          }
          uVar19 = uVar19 + 1;
          if (uVar19 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size) {
            ::std::__cxx11::string::append((char *)__return_storage_ptr__);
          }
        } while (uVar19 < (uint)(cop->arguments).super_VectorView<unsigned_int>.buffer_size);
      }
      ::std::__cxx11::string::append((char *)__return_storage_ptr__);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
        operator_delete(right_arg._M_dataplus._M_p);
      }
      pTVar18 = new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
      if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr ==
          (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) goto LAB_0013a312;
      goto LAB_0013a30d;
    }
    if (iVar1 == 0x51) {
      puVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      access_chain_internal_abi_cxx11_
                (__return_storage_ptr__,this,*puVar3,puVar3 + 1,
                 (int)(cop->arguments).super_VectorView<unsigned_int>.buffer_size - 1,1,
                 (AccessChainMeta *)0x0);
      goto LAB_0013a312;
    }
    if (iVar1 != 0x52) goto switchD_001396cd_caseD_7f;
    get_composite_constant_ids
              (&new_init,this,(ConstantID)(cop->arguments).super_VectorView<unsigned_int>.ptr[1]);
    const_id_00.id = (cop->super_IVariant).self.id;
    local_24c.id = (cop->basetype).id;
    uVar19 = 2;
    local_220 = this;
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size - 4 < 0xfffffffffffffffd) {
      uVar20 = uVar19;
      uVar8 = 3;
      const_id_01.id = const_id_00.id;
      do {
        uVar19 = uVar8;
        const_id_00.id = ParsedIR::increase_bound_by(&(this->super_Compiler).ir,1);
        uVar10 = (local_228->arguments).super_VectorView<unsigned_int>.ptr[uVar20];
        const_id.id = new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
                      [uVar10].id;
        new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[uVar10].id =
             const_id_00.id;
        set_composite_constant(this,const_id_01,local_24c,&new_init);
        get_composite_constant_ids
                  ((SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&tmp_const,this,
                   const_id);
        SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>::operator=
                  (&new_init,
                   (SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)&tmp_const);
        tmp_const.super_IVariant.self.id = 0;
        tmp_const.super_IVariant._12_4_ = 0;
        if ((Constant *)tmp_const.super_IVariant._vptr_IVariant != tmp_const.m.c[0].r + 1) {
          free(tmp_const.super_IVariant._vptr_IVariant);
        }
        pSVar7 = local_228;
        local_24c = get_composite_member_type
                              (local_220,local_24c,
                               (local_228->arguments).super_VectorView<unsigned_int>.ptr[uVar20]);
        uVar20 = uVar19;
        uVar8 = (ulong)((int)uVar19 + 1);
        const_id_01.id = const_id_00.id;
      } while (uVar19 < (pSVar7->arguments).super_VectorView<unsigned_int>.buffer_size - 1);
    }
    this_00 = local_220;
    pSVar7 = local_228;
    puVar4 = (local_228->arguments).super_VectorView<unsigned_int>.ptr;
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr[puVar4[uVar19]].id =
         *puVar4;
    set_composite_constant(local_220,const_id_00,local_24c,&new_init);
    SPIRConstant::SPIRConstant(&tmp_const,(pSVar7->basetype).id);
    type_id.id = (pSVar7->basetype).id;
    right_arg._M_dataplus._M_p._0_4_ = (pSVar7->super_IVariant).self.id;
    initializers = ::std::__detail::
                   _Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<unsigned_int,_std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>,_std::allocator<std::pair<const_unsigned_int,_spirv_cross::SmallVector<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_int>,_std::hash<unsigned_int>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&this_00->const_composite_insert_ids,(key_type *)&right_arg);
    fill_composite_constant(this_00,&tmp_const,type_id,initializers);
    constant_expression_abi_cxx11_(__return_storage_ptr__,this_00,&tmp_const,false,false);
    tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRConstant_003601a0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)tmp_const.specialization_constant_macro_name._M_dataplus._M_p !=
        &tmp_const.specialization_constant_macro_name.field_2) {
      operator_delete(tmp_const.specialization_constant_macro_name._M_dataplus._M_p);
    }
    tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.
    buffer_size = 0;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
        tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
        &tmp_const.subconstants.stack_storage) {
      free(tmp_const.subconstants.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr
          );
    }
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size = 0;
    tmp_const.m.c[0].r[2] =
         (Constant)new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
    if ((AlignedBuffer<spirv_cross::TypedID<(spirv_cross::Types)3>,_8UL> *)
        new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr ==
        &new_init.stack_storage) goto LAB_0013a312;
    goto LAB_0013a58c;
  }
  switch(iVar1) {
  case 0x7e:
    pcVar14 = "-";
    goto LAB_0013a48b;
  default:
switchD_001396cd_caseD_7f:
    prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
    ::std::runtime_error::runtime_error(prVar13,"Unimplemented spec constant op.");
LAB_0013a5d4:
    *(undefined ***)prVar13 = &PTR__runtime_error_0035fca8;
    __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
  case 0x80:
    pcVar14 = "+";
    break;
  case 0x82:
    pcVar14 = "-";
    break;
  case 0x84:
    pcVar14 = "*";
    break;
  case 0x86:
  case 0x87:
    pcVar14 = "/";
    break;
  case 0x89:
  case 0x8b:
    pcVar14 = "%";
    break;
  case 0x8a:
    puVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    uVar2 = *puVar3;
    id = puVar3[1];
    to_enclosed_expression_abi_cxx11_((string *)&tmp_const,this,uVar2,true);
    to_enclosed_expression_abi_cxx11_((string *)&new_init,this,id,true);
    to_enclosed_expression_abi_cxx11_(&right_arg,this,uVar2,true);
    to_enclosed_expression_abi_cxx11_(&local_248,this,id,true);
    join<std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[4],char_const(&)[2],std::__cxx11::string,char_const(&)[4],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2c2817,
               (char (*) [4])&new_init,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d6c93,
               (char (*) [4])0x2d522e,(char (*) [2])&right_arg,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d3944,
               (char (*) [4])&local_248,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
               (char (*) [2])__return_storage_ptr__);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_248._M_dataplus._M_p != &local_248.field_2) {
      operator_delete(local_248._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
        (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) {
      operator_delete(new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr);
    }
    pTVar18 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_0013a312;
    goto LAB_0013a30d;
  case 0xa4:
  case 0xaa:
    pcVar14 = "==";
    break;
  case 0xa5:
  case 0xab:
    pcVar14 = "!=";
    break;
  case 0xa6:
    pcVar14 = "||";
    break;
  case 0xa7:
    pcVar14 = "&&";
    break;
  case 0xa8:
    pcVar14 = "!";
    goto LAB_0013a48b;
  case 0xa9:
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 3) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar13,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_0013a5d4;
    }
    puVar4 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    in_R9 = (char (*) [2])(ulong)*puVar4;
    bVar9 = to_trivial_mix_op(this,type,&op,puVar4[2],puVar4[1],*puVar4);
    if (!bVar9) {
      puVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
      to_ternary_expression_abi_cxx11_(__return_storage_ptr__,this,type,*puVar3,puVar3[1],puVar3[2])
      ;
      goto LAB_0013a312;
    }
LAB_0013a47a:
    bVar9 = false;
    bVar5 = false;
    goto LAB_00139e65;
  case 0xac:
  case 0xad:
    pcVar14 = ">";
    break;
  case 0xae:
  case 0xaf:
    pcVar14 = ">=";
    break;
  case 0xb0:
  case 0xb1:
    pcVar14 = "<";
    break;
  case 0xb2:
  case 0xb3:
    pcVar14 = "<=";
    break;
  case 0xc2:
  case 0xc3:
    pcVar14 = ">>";
    break;
  case 0xc4:
    pcVar14 = "<<";
    break;
  case 0xc5:
    pcVar14 = "|";
    break;
  case 0xc6:
    pcVar14 = "^";
    break;
  case 199:
    pcVar14 = "&";
    break;
  case 200:
    pcVar14 = "~";
LAB_0013a48b:
    bVar5 = false;
    ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar14);
    bVar9 = true;
    goto LAB_00139e65;
  }
  bVar9 = false;
  ::std::__cxx11::string::_M_replace((ulong)&op,0,(char *)0x0,(ulong)pcVar14);
  bVar5 = true;
LAB_00139e65:
  if ((bVar9 || bVar5) ||
     (uVar10 = 0xfffffff8, *(int *)&(cop->super_IVariant).field_0xc - 0x71U < 2)) {
    pSVar11 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    uVar10 = pSVar11->width - 8;
  }
  iVar1 = *(int *)&(cop->super_IVariant).field_0xc;
  skip_cast_if_equal_type = true;
  if (((0x2b < iVar1 - 0x80U) || ((0xc0000000015U >> ((ulong)(iVar1 - 0x80U) & 0x3f) & 1) == 0)) &&
     (3 < iVar1 - 0xc4U)) {
    skip_cast_if_equal_type = false;
  }
  if (iVar1 < 0xaa) {
    if (iVar1 < 0x86) {
      if (iVar1 == 0x71) {
switchD_00139f53_caseD_86:
        uVar16 = uVar10 << 0x1d | uVar10 >> 3;
        if ((7 < uVar16) || ((0x8bU >> (uVar10 >> 3 & 0x1f) & 1) == 0)) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar13,"Invalid bit width.");
          goto LAB_0013a6cb;
        }
        puVar17 = &DAT_002be624;
        goto LAB_00139fb0;
      }
      if ((iVar1 == 0x72) || (iVar1 == 0x7e)) goto switchD_00139f53_caseD_87;
    }
    else {
      switch(iVar1) {
      case 0x86:
      case 0x89:
        goto switchD_00139f53_caseD_86;
      case 0x87:
      case 0x8b:
switchD_00139f53_caseD_87:
        uVar16 = uVar10 << 0x1d | uVar10 >> 3;
        if ((7 < uVar16) || ((0x8bU >> (uVar10 >> 3 & 0x1f) & 1) == 0)) {
          prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
          ::std::runtime_error::runtime_error(prVar13,"Invalid bit width.");
          goto LAB_0013a6cb;
        }
        goto LAB_00139f82;
      }
    }
switchD_00139f53_caseD_88:
    input_type = type->basetype;
  }
  else {
    uVar16 = iVar1 - 0xaa;
    if (0x19 < uVar16) goto switchD_00139f53_caseD_88;
    if ((0x1000154U >> (uVar16 & 0x1f) & 1) != 0) goto switchD_00139f53_caseD_86;
    if ((0x20002a8U >> (uVar16 & 0x1f) & 1) != 0) goto switchD_00139f53_caseD_87;
    if ((3U >> (uVar16 & 0x1f) & 1) == 0) goto switchD_00139f53_caseD_88;
    uVar16 = uVar10 << 0x1d | uVar10 >> 3;
    if ((7 < uVar16) || ((0x8bU >> (uVar10 >> 3 & 0x1f) & 1) == 0)) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar13,"Invalid bit width.");
      goto LAB_0013a6cb;
    }
LAB_00139f82:
    puVar17 = &DAT_002be604;
LAB_00139fb0:
    input_type = *(BaseType *)(puVar17 + (ulong)uVar16 * 4);
  }
  if (bVar5) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size < 2) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar13,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_0013a6cb;
    }
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.buffer_size = 0;
    new_init.buffer_capacity._0_1_ = 0;
    right_arg._M_string_length = 0;
    right_arg.field_2._M_local_buf[0] = '\0';
    puVar3 = (cop->arguments).super_VectorView<unsigned_int>.ptr;
    new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr =
         (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity;
    right_arg._M_dataplus._M_p = (pointer)&right_arg.field_2;
    binary_op_bitcast_helper
              ((SPIRType *)&tmp_const,this,(string *)&new_init,&right_arg,&input_type,*puVar3,
               puVar3[1],skip_cast_if_equal_type);
    if (type->basetype == Boolean || type->basetype == input_type) {
      join<char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)0x2d522e,(char (*) [2])&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                 (char (*) [2])&right_arg,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,
                 (char (*) [2])__return_storage_ptr__);
    }
    else {
      tmp_const.m.c[0].r[0].u32 = input_type;
      (*(this->super_Compiler)._vptr_Compiler[0x3c])(__return_storage_ptr__,this,type);
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&,char_const(&)[2],std::__cxx11::string&>
                (&local_248,(spirv_cross *)&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                 (char (*) [2])&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2be236,
                 (char (*) [2])&right_arg,__return_storage_ptr__);
      ::std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_248._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_248._M_dataplus._M_p != &local_248.field_2) {
        operator_delete(local_248._M_dataplus._M_p);
      }
      ::std::__cxx11::string::push_back((char)__return_storage_ptr__);
    }
    tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
    ::std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)&tmp_const.subconstants.stack_storage);
    tmp_const.m.c[3].id[0].id = 0;
    tmp_const.m.c[3].id[1].id = 0;
    if ((uint32_t *)tmp_const.m.c[3].r[3].u64 != &tmp_const.m.c[3].vecsize) {
      free((void *)tmp_const.m.c[3].r[3]);
    }
    tmp_const.m.c[2].id[0].id = 0;
    tmp_const.m.c[2].id[1].id = 0;
    if ((uint32_t *)tmp_const.m.c[2].r[3].u64 != &tmp_const.m.c[2].vecsize) {
      free((void *)tmp_const.m.c[2].r[3]);
    }
    tmp_const.m.c[1].r[3].u64 = 0;
    if ((ID *)tmp_const.m.c[1].r[2].u64 != tmp_const.m.c[1].id + 2) {
      free((void *)tmp_const.m.c[1].r[2]);
    }
    tmp_const.m.c[0].r[3].u64 = 0;
    if ((ID *)tmp_const.m.c[0].r[2].u64 != tmp_const.m.c[0].id + 2) {
      free((void *)tmp_const.m.c[0].r[2]);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)right_arg._M_dataplus._M_p != &right_arg.field_2) {
      operator_delete(right_arg._M_dataplus._M_p);
    }
    pTVar18 = new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr;
    if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr ==
        (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) goto LAB_0013a312;
  }
  else if (bVar9) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar13,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_0013a6cb;
    }
    bitcast_glsl_abi_cxx11_
              ((string *)&tmp_const,this,type,*(cop->arguments).super_VectorView<unsigned_int>.ptr);
    join<char_const(&)[2],std::__cxx11::string&,std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)0x2d522e,(char (*) [2])&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,in_R9);
    pTVar18 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_0013a312;
  }
  else if (iVar1 - 0x71U < 2) {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar13,"Not enough arguments to OpSpecConstantOp.");
LAB_0013a6cb:
      *(undefined ***)prVar13 = &PTR__runtime_error_0035fca8;
      __cxa_throw(prVar13,&CompilerError::typeinfo,::std::runtime_error::~runtime_error);
    }
    pSVar11 = Compiler::expression_type
                        (&this->super_Compiler,*(cop->arguments).super_VectorView<unsigned_int>.ptr)
    ;
    BVar6 = input_type;
    if ((pSVar11->width < type->width) && (input_type != pSVar11->basetype)) {
      SPIRType::SPIRType((SPIRType *)&tmp_const,pSVar11);
      tmp_const.m.c[0].r[0].u32 = BVar6;
      bitcast_glsl_abi_cxx11_
                ((string *)&new_init,this,(SPIRType *)&tmp_const,
                 *(cop->arguments).super_VectorView<unsigned_int>.ptr);
      join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
                (__return_storage_ptr__,(spirv_cross *)&op,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
                 (char (*) [2])&new_init,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,in_R9
                );
      if (new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr !=
          (TypedID<(spirv_cross::Types)3> *)&new_init.buffer_capacity) {
        operator_delete(new_init.super_VectorView<spirv_cross::TypedID<(spirv_cross::Types)3>_>.ptr)
        ;
      }
      tmp_const.super_IVariant._vptr_IVariant = (_func_int **)&PTR__SPIRType_00360128;
      ::std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                     *)&tmp_const.subconstants.stack_storage);
      tmp_const.m.c[3].id[0].id = 0;
      tmp_const.m.c[3].id[1].id = 0;
      if ((uint32_t *)tmp_const.m.c[3].r[3].u64 != &tmp_const.m.c[3].vecsize) {
        free((void *)tmp_const.m.c[3].r[3]);
      }
      tmp_const.m.c[2].id[0].id = 0;
      tmp_const.m.c[2].id[1].id = 0;
      if ((uint32_t *)tmp_const.m.c[2].r[3].u64 != &tmp_const.m.c[2].vecsize) {
        free((void *)tmp_const.m.c[2].r[3]);
      }
      tmp_const.m.c[1].r[3].u64 = 0;
      if ((ID *)tmp_const.m.c[1].r[2].u64 != tmp_const.m.c[1].id + 2) {
        free((void *)tmp_const.m.c[1].r[2]);
      }
      tmp_const.m.c[0].r[3].u64 = 0;
      if ((ID *)tmp_const.m.c[0].r[2].u64 != tmp_const.m.c[0].id + 2) {
LAB_0013a58c:
        free((void *)tmp_const.m.c[0].r[2]);
      }
      goto LAB_0013a312;
    }
    to_expression_abi_cxx11_
              ((string *)&tmp_const,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
               (char (*) [2])&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,in_R9);
    pTVar18 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_0013a312;
  }
  else {
    if ((cop->arguments).super_VectorView<unsigned_int>.buffer_size == 0) {
      prVar13 = (runtime_error *)__cxa_allocate_exception(0x10);
      ::std::runtime_error::runtime_error(prVar13,"Not enough arguments to OpSpecConstantOp.");
      goto LAB_0013a6cb;
    }
    to_expression_abi_cxx11_
              ((string *)&tmp_const,this,*(cop->arguments).super_VectorView<unsigned_int>.ptr,true);
    join<std::__cxx11::string&,char_const(&)[2],std::__cxx11::string,char_const(&)[2]>
              (__return_storage_ptr__,(spirv_cross *)&op,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2d522e,
               (char (*) [2])&tmp_const,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x2bd856,in_R9);
    pTVar18 = (TypedID<(spirv_cross::Types)3> *)tmp_const.super_IVariant._vptr_IVariant;
    if ((ConstantMatrix *)tmp_const.super_IVariant._vptr_IVariant == &tmp_const.m)
    goto LAB_0013a312;
  }
LAB_0013a30d:
  operator_delete(pTVar18);
LAB_0013a312:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)op._M_dataplus._M_p != &op.field_2) {
    operator_delete(op._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string CompilerGLSL::constant_op_expression(const SPIRConstantOp &cop)
{
	auto &type = get<SPIRType>(cop.basetype);
	bool binary = false;
	bool unary = false;
	string op;

	if (is_legacy() && is_unsigned_opcode(cop.opcode))
		SPIRV_CROSS_THROW("Unsigned integers are not supported on legacy targets.");

	// TODO: Find a clean way to reuse emit_instruction.
	switch (cop.opcode)
	{
	case OpSConvert:
	case OpUConvert:
	case OpFConvert:
		op = type_to_glsl_constructor(type);
		break;

#define GLSL_BOP(opname, x) \
	case Op##opname:        \
		binary = true;      \
		op = x;             \
		break

#define GLSL_UOP(opname, x) \
	case Op##opname:        \
		unary = true;       \
		op = x;             \
		break

		GLSL_UOP(SNegate, "-");
		GLSL_UOP(Not, "~");
		GLSL_BOP(IAdd, "+");
		GLSL_BOP(ISub, "-");
		GLSL_BOP(IMul, "*");
		GLSL_BOP(SDiv, "/");
		GLSL_BOP(UDiv, "/");
		GLSL_BOP(UMod, "%");
		GLSL_BOP(SMod, "%");
		GLSL_BOP(ShiftRightLogical, ">>");
		GLSL_BOP(ShiftRightArithmetic, ">>");
		GLSL_BOP(ShiftLeftLogical, "<<");
		GLSL_BOP(BitwiseOr, "|");
		GLSL_BOP(BitwiseXor, "^");
		GLSL_BOP(BitwiseAnd, "&");
		GLSL_BOP(LogicalOr, "||");
		GLSL_BOP(LogicalAnd, "&&");
		GLSL_UOP(LogicalNot, "!");
		GLSL_BOP(LogicalEqual, "==");
		GLSL_BOP(LogicalNotEqual, "!=");
		GLSL_BOP(IEqual, "==");
		GLSL_BOP(INotEqual, "!=");
		GLSL_BOP(ULessThan, "<");
		GLSL_BOP(SLessThan, "<");
		GLSL_BOP(ULessThanEqual, "<=");
		GLSL_BOP(SLessThanEqual, "<=");
		GLSL_BOP(UGreaterThan, ">");
		GLSL_BOP(SGreaterThan, ">");
		GLSL_BOP(UGreaterThanEqual, ">=");
		GLSL_BOP(SGreaterThanEqual, ">=");

	case OpSRem:
	{
		uint32_t op0 = cop.arguments[0];
		uint32_t op1 = cop.arguments[1];
		return join(to_enclosed_expression(op0), " - ", to_enclosed_expression(op1), " * ", "(",
		                 to_enclosed_expression(op0), " / ", to_enclosed_expression(op1), ")");
	}

	case OpSelect:
	{
		if (cop.arguments.size() < 3)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// This one is pretty annoying. It's triggered from
		// uint(bool), int(bool) from spec constants.
		// In order to preserve its compile-time constness in Vulkan GLSL,
		// we need to reduce the OpSelect expression back to this simplified model.
		// If we cannot, fail.
		if (to_trivial_mix_op(type, op, cop.arguments[2], cop.arguments[1], cop.arguments[0]))
		{
			// Implement as a simple cast down below.
		}
		else
		{
			// Implement a ternary and pray the compiler understands it :)
			return to_ternary_expression(type, cop.arguments[0], cop.arguments[1], cop.arguments[2]);
		}
		break;
	}

	case OpVectorShuffle:
	{
		string expr = type_to_glsl_constructor(type);
		expr += "(";

		uint32_t left_components = expression_type(cop.arguments[0]).vecsize;
		string left_arg = to_enclosed_expression(cop.arguments[0]);
		string right_arg = to_enclosed_expression(cop.arguments[1]);

		for (uint32_t i = 2; i < uint32_t(cop.arguments.size()); i++)
		{
			uint32_t index = cop.arguments[i];
			if (index == 0xFFFFFFFF)
			{
				SPIRConstant c;
				c.constant_type = type.parent_type;
				assert(type.parent_type != ID(0));
				expr += constant_expression(c);
			}
			else if (index >= left_components)
			{
				expr += right_arg + "." + "xyzw"[index - left_components];
			}
			else
			{
				expr += left_arg + "." + "xyzw"[index];
			}

			if (i + 1 < uint32_t(cop.arguments.size()))
				expr += ", ";
		}

		expr += ")";
		return expr;
	}

	case OpCompositeExtract:
	{
		auto expr = access_chain_internal(cop.arguments[0], &cop.arguments[1], uint32_t(cop.arguments.size() - 1),
		                                  ACCESS_CHAIN_INDEX_IS_LITERAL_BIT, nullptr);
		return expr;
	}

	case OpCompositeInsert:
	{
		SmallVector<ConstantID> new_init = get_composite_constant_ids(cop.arguments[1]);
		uint32_t idx;
		uint32_t target_id = cop.self;
		uint32_t target_type_id = cop.basetype;
		// We have to drill down to the part we want to modify, and create new
		// constants for each containing part.
		for (idx = 2; idx < cop.arguments.size() - 1; ++idx)
		{
			uint32_t new_const = ir.increase_bound_by(1);
			uint32_t old_const = new_init[cop.arguments[idx]];
			new_init[cop.arguments[idx]] = new_const;
			set_composite_constant(target_id, target_type_id, new_init);
			new_init = get_composite_constant_ids(old_const);
			target_id = new_const;
			target_type_id = get_composite_member_type(target_type_id, cop.arguments[idx]);
		}
		// Now replace the initializer with the one from this instruction.
		new_init[cop.arguments[idx]] = cop.arguments[0];
		set_composite_constant(target_id, target_type_id, new_init);
		SPIRConstant tmp_const(cop.basetype);
		fill_composite_constant(tmp_const, cop.basetype, const_composite_insert_ids[cop.self]);
		return constant_expression(tmp_const);
	}

	default:
		// Some opcodes are unimplemented here, these are currently not possible to test from glslang.
		SPIRV_CROSS_THROW("Unimplemented spec constant op.");
	}

	uint32_t bit_width = 0;
	if (unary || binary || cop.opcode == OpSConvert || cop.opcode == OpUConvert)
		bit_width = expression_type(cop.arguments[0]).width;

	SPIRType::BaseType input_type;
	bool skip_cast_if_equal_type = opcode_is_sign_invariant(cop.opcode);

	switch (cop.opcode)
	{
	case OpIEqual:
	case OpINotEqual:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpSLessThan:
	case OpSLessThanEqual:
	case OpSGreaterThan:
	case OpSGreaterThanEqual:
	case OpSMod:
	case OpSDiv:
	case OpShiftRightArithmetic:
	case OpSConvert:
	case OpSNegate:
		input_type = to_signed_basetype(bit_width);
		break;

	case OpULessThan:
	case OpULessThanEqual:
	case OpUGreaterThan:
	case OpUGreaterThanEqual:
	case OpUMod:
	case OpUDiv:
	case OpShiftRightLogical:
	case OpUConvert:
		input_type = to_unsigned_basetype(bit_width);
		break;

	default:
		input_type = type.basetype;
		break;
	}

#undef GLSL_BOP
#undef GLSL_UOP
	if (binary)
	{
		if (cop.arguments.size() < 2)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		string cast_op0;
		string cast_op1;
		auto expected_type = binary_op_bitcast_helper(cast_op0, cast_op1, input_type, cop.arguments[0],
		                                              cop.arguments[1], skip_cast_if_equal_type);

		if (type.basetype != input_type && type.basetype != SPIRType::Boolean)
		{
			expected_type.basetype = input_type;
			auto expr = bitcast_glsl_op(type, expected_type);
			expr += '(';
			expr += join(cast_op0, " ", op, " ", cast_op1);
			expr += ')';
			return expr;
		}
		else
			return join("(", cast_op0, " ", op, " ", cast_op1, ")");
	}
	else if (unary)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		// Auto-bitcast to result type as needed.
		// Works around various casting scenarios in glslang as there is no OpBitcast for specialization constants.
		return join("(", op, bitcast_glsl(type, cop.arguments[0]), ")");
	}
	else if (cop.opcode == OpSConvert || cop.opcode == OpUConvert)
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");

		auto &arg_type = expression_type(cop.arguments[0]);
		if (arg_type.width < type.width && input_type != arg_type.basetype)
		{
			auto expected = arg_type;
			expected.basetype = input_type;
			return join(op, "(", bitcast_glsl(expected, cop.arguments[0]), ")");
		}
		else
			return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
	else
	{
		if (cop.arguments.size() < 1)
			SPIRV_CROSS_THROW("Not enough arguments to OpSpecConstantOp.");
		return join(op, "(", to_expression(cop.arguments[0]), ")");
	}
}